

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::CommandLineInterface::MemoryOutputStream::~MemoryOutputStream
          (MemoryOutputStream *this)

{
  string *__k;
  string *psVar1;
  size_type sVar2;
  ulong uVar3;
  StringOutputStream *pSVar4;
  mapped_type *ppbVar5;
  long lVar6;
  ostream *poVar7;
  mapped_type pbVar8;
  long lVar9;
  LogMessage *pLVar10;
  pointer pcVar11;
  ulong uVar12;
  int i;
  size_type sVar13;
  int iVar14;
  int iVar15;
  size_t __n;
  string *psVar16;
  string *__dest;
  string indent_;
  string magic_string;
  SubstituteArg local_1e8;
  SubstituteArg local_1b0;
  undefined8 local_180;
  undefined4 local_178;
  SubstituteArg local_150;
  SubstituteArg local_120;
  SubstituteArg local_f0;
  SubstituteArg local_c0;
  SubstituteArg local_90;
  SubstituteArg local_60;
  
  *(undefined ***)this = &PTR__MemoryOutputStream_0019a918;
  internal::scoped_ptr<google::protobuf::io::StringOutputStream>::reset
            (&this->inner_,(StringOutputStream *)0x0);
  __k = &this->filename_;
  ppbVar5 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>
            ::operator[](&this->directory_->files_,__k);
  if ((this->insertion_point_)._M_string_length == 0) {
    if (*ppbVar5 == (mapped_type)0x0) {
      pbVar8 = (mapped_type)operator_new(0x20);
      (pbVar8->_M_dataplus)._M_p = (pointer)&pbVar8->field_2;
      pbVar8->_M_string_length = 0;
      (pbVar8->field_2)._M_local_buf[0] = '\0';
      *ppbVar5 = pbVar8;
      std::__cxx11::string::swap((string *)pbVar8);
      goto LAB_0013efc3;
    }
    poVar7 = std::operator<<((ostream *)&std::cerr,(string *)__k);
    poVar7 = std::operator<<(poVar7,": Tried to write the same file twice.");
    std::endl<char,std::char_traits<char>>(poVar7);
  }
  else {
    psVar1 = &this->data_;
    sVar2 = (this->data_)._M_string_length;
    if ((sVar2 != 0) && ((psVar1->_M_dataplus)._M_p[sVar2 - 1] != '\n')) {
      std::__cxx11::string::push_back((char)psVar1);
    }
    pbVar8 = *ppbVar5;
    if (pbVar8 != (mapped_type)0x0) {
      local_1e8.text_ = (this->insertion_point_)._M_dataplus._M_p;
      local_1e8.size_ = (int)(this->insertion_point_)._M_string_length;
      indent_._M_dataplus._M_p = (pointer)0x0;
      indent_._M_string_length._0_4_ = -1;
      local_1b0.text_ = (char *)0x0;
      local_1b0.size_ = -1;
      local_60.text_ = (char *)0x0;
      local_60.size_ = -1;
      local_90.text_ = (char *)0x0;
      local_90.size_ = -1;
      local_c0.text_ = (char *)0x0;
      local_c0.size_ = -1;
      local_f0.text_ = (char *)0x0;
      local_f0.size_ = -1;
      local_120.text_ = (char *)0x0;
      local_120.size_ = -1;
      local_150.text_ = (char *)0x0;
      local_150.size_ = -1;
      local_180 = 0;
      local_178 = 0xffffffff;
      google::protobuf::strings::Substitute_abi_cxx11_
                ((char *)&magic_string,(SubstituteArg *)"@@protoc_insertion_point($0)",&local_1e8,
                 (SubstituteArg *)&indent_,&local_1b0,&local_60,&local_90,&local_c0,&local_f0,
                 &local_120,&local_150);
      lVar6 = std::__cxx11::string::find((string *)pbVar8,(ulong)&magic_string);
      if (lVar6 == -1) {
        poVar7 = std::operator<<((ostream *)&std::cerr,(string *)__k);
        poVar7 = std::operator<<(poVar7,": insertion point \"");
        poVar7 = std::operator<<(poVar7,(string *)&this->insertion_point_);
        poVar7 = std::operator<<(poVar7,"\" not found.");
        std::endl<char,std::char_traits<char>>(poVar7);
        this->directory_->had_error_ = true;
      }
      else {
        lVar6 = std::__cxx11::string::rfind((char)pbVar8,10);
        psVar16 = (string *)(lVar6 + 1);
        lVar6 = std::__cxx11::string::find_first_not_of((char *)pbVar8,0x16a31d);
        std::__cxx11::string::string
                  ((string *)&indent_,(string *)pbVar8,(ulong)psVar16,lVar6 - (long)psVar16);
        if (CONCAT44(indent_._M_string_length._4_4_,(int)indent_._M_string_length) == 0) {
          std::__cxx11::string::insert((ulong)pbVar8,psVar16);
        }
        else {
          sVar2 = (this->data_)._M_string_length;
          iVar14 = 0;
          for (sVar13 = 0; sVar2 != sVar13; sVar13 = sVar13 + 1) {
            iVar15 = 0;
            if ((this->data_)._M_dataplus._M_p[sVar13] == '\n') {
              iVar15 = (int)indent_._M_string_length;
            }
            iVar14 = iVar14 + iVar15;
          }
          std::__cxx11::string::insert((ulong)pbVar8,(ulong)psVar16,(char)sVar2 + (char)iVar14);
          if (pbVar8->_M_string_length == 0) {
            pcVar11 = (pointer)0x0;
          }
          else {
            pcVar11 = (pbVar8->_M_dataplus)._M_p;
          }
          __dest = psVar16 + (long)pcVar11;
          uVar12 = 0;
          while (uVar3 = (this->data_)._M_string_length, uVar12 < uVar3) {
            memcpy(__dest,indent_._M_dataplus._M_p,
                   CONCAT44(indent_._M_string_length._4_4_,(int)indent_._M_string_length));
            lVar6 = CONCAT44(indent_._M_string_length._4_4_,(int)indent_._M_string_length);
            lVar9 = std::__cxx11::string::find((char)psVar1,10);
            __n = (lVar9 + 1U) - uVar12;
            memcpy(__dest + lVar6,(psVar1->_M_dataplus)._M_p + uVar12,__n);
            __dest = __dest + lVar6 + __n;
            uVar12 = lVar9 + 1U;
          }
          if (pbVar8->_M_string_length == 0) {
            pcVar11 = (pointer)0x0;
          }
          else {
            pcVar11 = (pbVar8->_M_dataplus)._M_p;
          }
          if (__dest != psVar16 + (long)(pcVar11 + uVar3 + (long)iVar14)) {
            google::protobuf::internal::LogMessage::LogMessage
                      ((LogMessage *)&local_1e8,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/compiler/command_line_interface.cc"
                       ,0x22f);
            pLVar10 = (LogMessage *)
                      google::protobuf::internal::LogMessage::operator<<
                                ((LogMessage *)&local_1e8,
                                 "CHECK failed: (target_ptr) == (string_as_array(target) + pos + data_.size() + indent_size): "
                                );
            google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_1b0,pLVar10);
            google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)&local_1e8);
          }
        }
        std::__cxx11::string::~string((string *)&indent_);
      }
      std::__cxx11::string::~string((string *)&magic_string);
      goto LAB_0013efc3;
    }
    poVar7 = std::operator<<((ostream *)&std::cerr,(string *)__k);
    poVar7 = std::operator<<(poVar7,": Tried to insert into file that doesn\'t exist.");
    std::endl<char,std::char_traits<char>>(poVar7);
  }
  this->directory_->had_error_ = true;
LAB_0013efc3:
  pSVar4 = (this->inner_).ptr_;
  if (pSVar4 != (StringOutputStream *)0x0) {
    (**(code **)(*(long *)pSVar4 + 8))();
  }
  std::__cxx11::string::~string((string *)&this->data_);
  std::__cxx11::string::~string((string *)&this->insertion_point_);
  std::__cxx11::string::~string((string *)__k);
  google::protobuf::io::ZeroCopyOutputStream::~ZeroCopyOutputStream
            (&this->super_ZeroCopyOutputStream);
  return;
}

Assistant:

CommandLineInterface::MemoryOutputStream::~MemoryOutputStream() {
  // Make sure all data has been written.
  inner_.reset();

  // Insert into the directory.
  string** map_slot = &directory_->files_[filename_];

  if (insertion_point_.empty()) {
    // This was just a regular Open().
    if (*map_slot != NULL) {
      cerr << filename_ << ": Tried to write the same file twice." << endl;
      directory_->had_error_ = true;
      return;
    }

    *map_slot = new string;
    (*map_slot)->swap(data_);
  } else {
    // This was an OpenForInsert().

    // If the data doens't end with a clean line break, add one.
    if (!data_.empty() && data_[data_.size() - 1] != '\n') {
      data_.push_back('\n');
    }

    // Find the file we are going to insert into.
    if (*map_slot == NULL) {
      cerr << filename_ << ": Tried to insert into file that doesn't exist."
           << endl;
      directory_->had_error_ = true;
      return;
    }
    string* target = *map_slot;

    // Find the insertion point.
    string magic_string = strings::Substitute(
        "@@protoc_insertion_point($0)", insertion_point_);
    string::size_type pos = target->find(magic_string);

    if (pos == string::npos) {
      cerr << filename_ << ": insertion point \"" << insertion_point_
           << "\" not found." << endl;
      directory_->had_error_ = true;
      return;
    }

    // Seek backwards to the beginning of the line, which is where we will
    // insert the data.  Note that this has the effect of pushing the insertion
    // point down, so the data is inserted before it.  This is intentional
    // because it means that multiple insertions at the same point will end
    // up in the expected order in the final output.
    pos = target->find_last_of('\n', pos);
    if (pos == string::npos) {
      // Insertion point is on the first line.
      pos = 0;
    } else {
      // Advance to character after '\n'.
      ++pos;
    }

    // Extract indent.
    string indent_(*target, pos, target->find_first_not_of(" \t", pos) - pos);

    if (indent_.empty()) {
      // No indent.  This makes things easier.
      target->insert(pos, data_);
    } else {
      // Calculate how much space we need.
      int indent_size = 0;
      for (int i = 0; i < data_.size(); i++) {
        if (data_[i] == '\n') indent_size += indent_.size();
      }

      // Make a hole for it.
      target->insert(pos, data_.size() + indent_size, '\0');

      // Now copy in the data.
      string::size_type data_pos = 0;
      char* target_ptr = string_as_array(target) + pos;
      while (data_pos < data_.size()) {
        // Copy indent.
        memcpy(target_ptr, indent_.data(), indent_.size());
        target_ptr += indent_.size();

        // Copy line from data_.
        // We already guaranteed that data_ ends with a newline (above), so this
        // search can't fail.
        string::size_type line_length =
            data_.find_first_of('\n', data_pos) + 1 - data_pos;
        memcpy(target_ptr, data_.data() + data_pos, line_length);
        target_ptr += line_length;
        data_pos += line_length;
      }

      GOOGLE_CHECK_EQ(target_ptr,
          string_as_array(target) + pos + data_.size() + indent_size);
    }
  }
}